

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufferAddHead(xmlBufferPtr buf,xmlChar *str,int len)

{
  uint uVar1;
  int iVar2;
  uint local_24;
  uint start;
  int len_local;
  xmlChar *str_local;
  xmlBufferPtr buf_local;
  
  if ((buf == (xmlBufferPtr)0x0) || (str == (xmlChar *)0x0)) {
    buf_local._4_4_ = 0x73;
  }
  else {
    local_24 = len;
    if (len < 0) {
      local_24 = xmlStrlen(str);
    }
    if (local_24 == 0) {
      buf_local._4_4_ = 0;
    }
    else {
      if (buf->alloc == XML_BUFFER_ALLOC_IO) {
        uVar1 = (int)buf->content - (int)buf->contentIO;
        if (local_24 <= uVar1) {
          buf->content = buf->content + -(long)(int)local_24;
          memmove(buf->content,str,(long)(int)local_24);
          buf->use = local_24 + buf->use;
          buf->size = local_24 + buf->size;
          return 0;
        }
        if (local_24 < (buf->size + uVar1) - buf->use) {
          memmove(buf->contentIO + (int)local_24,buf->content,(ulong)(buf->use + 1));
          memmove(buf->contentIO,str,(long)(int)local_24);
          buf->content = buf->contentIO;
          buf->use = local_24 + buf->use;
          buf->size = uVar1 + buf->size;
          return 0;
        }
      }
      if ((local_24 < buf->size - buf->use) || (iVar2 = xmlBufferGrow(buf,local_24), -1 < iVar2)) {
        memmove(buf->content + (int)local_24,buf->content,(ulong)(buf->use + 1));
        memmove(buf->content,str,(long)(int)local_24);
        buf->use = local_24 + buf->use;
        buf_local._4_4_ = 0;
      }
      else {
        buf_local._4_4_ = -1;
      }
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufferAddHead(xmlBufferPtr buf, const xmlChar *str, int len) {
    unsigned start = 0;

    if ((buf == NULL) || (str == NULL))
	return(XML_ERR_ARGUMENT);
    if (len < 0)
        len = xmlStrlen(str);
    if (len == 0)
        return(XML_ERR_OK);

    if (buf->alloc == XML_BUFFER_ALLOC_IO) {
        start = buf->content - buf->contentIO;

        /*
         * We can add it in the space previously shrunk
         */
        if ((unsigned) len <= start) {
            buf->content -= len;
            memmove(&buf->content[0], str, len);
            buf->use += len;
            buf->size += len;
            return(0);
        }
        if ((unsigned) len < buf->size + start - buf->use) {
            memmove(&buf->contentIO[len], buf->content, buf->use + 1);
            memmove(buf->contentIO, str, len);
            buf->content = buf->contentIO;
            buf->use += len;
            buf->size += start;
            return(0);
        }
    }

    if ((unsigned) len >= buf->size - buf->use) {
        if (xmlBufferGrow(buf, len) < 0)
            return(-1);
    }

    memmove(&buf->content[len], buf->content, buf->use + 1);
    memmove(buf->content, str, len);
    buf->use += len;
    return (0);
}